

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O2

void __thiscall CFFFileInput::FreeData(CFFFileInput *this)

{
  FontDictInfo *pFVar1;
  CharStrings *pCVar2;
  FontDictInfo **ppFVar3;
  char **ppcVar4;
  CharStringsIndex pCVar5;
  void *pvVar6;
  PrivateDictInfo *pPVar7;
  pointer ppCVar8;
  pointer ppEVar9;
  _Base_ptr p_Var10;
  long lVar11;
  _Base_ptr p_Var12;
  CharSetInfo *pCVar13;
  pointer ppCVar14;
  pointer ppEVar15;
  TopDictInfo *pTVar16;
  unsigned_long i_1;
  unsigned_long i;
  ulong uVar17;
  EncodingsInfo *pEVar18;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->mName);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::clear(&(this->mNameToIndex)._M_t);
  if (this->mTopDictIndex != (TopDictInfo *)0x0) {
    for (uVar17 = 0; pTVar16 = this->mTopDictIndex, uVar17 < this->mFontsCount; uVar17 = uVar17 + 1)
    {
      pFVar1 = pTVar16[uVar17].mFDArray;
      if (pFVar1 != (FontDictInfo *)0x0) {
        pCVar2 = pFVar1[-1].mPrivateDict.mLocalSubrs;
        if (pCVar2 != (CharStrings *)0x0) {
          lVar11 = (long)pCVar2 * 0x88;
          do {
            FontDictInfo::~FontDictInfo((FontDictInfo *)((long)&pFVar1[-1].mFontDictStart + lVar11))
            ;
            lVar11 = lVar11 + -0x88;
          } while (lVar11 != 0);
        }
        operator_delete__(&pFVar1[-1].mPrivateDict.mLocalSubrs,(long)pCVar2 * 0x88 + 8);
        pTVar16 = this->mTopDictIndex;
      }
      if (pTVar16[uVar17].mFDSelect != (FontDictInfo **)0x0) {
        operator_delete__(pTVar16[uVar17].mFDSelect);
      }
    }
    if (pTVar16 != (TopDictInfo *)0x0) {
      ppFVar3 = pTVar16[-1].mFDSelect;
      if (ppFVar3 != (FontDictInfo **)0x0) {
        lVar11 = (long)ppFVar3 * 0x50;
        do {
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
                       *)(&pTVar16[-1].mTopDict._M_t._M_impl.field_0x0 + lVar11));
          lVar11 = lVar11 + -0x50;
        } while (lVar11 != 0);
      }
      operator_delete__(&pTVar16[-1].mFDSelect,(long)ppFVar3 * 0x50 | 8);
    }
    this->mTopDictIndex = (TopDictInfo *)0x0;
  }
  if (this->mStrings != (char **)0x0) {
    for (uVar17 = 0; ppcVar4 = this->mStrings, uVar17 < this->mStringsCount; uVar17 = uVar17 + 1) {
      if (ppcVar4[uVar17] != (char *)0x0) {
        operator_delete__(ppcVar4[uVar17]);
      }
    }
    if (ppcVar4 != (char **)0x0) {
      operator_delete__(ppcVar4);
    }
    this->mStrings = (char **)0x0;
  }
  std::
  _Rb_tree<const_char_*,_std::pair<const_char_*const,_unsigned_short>,_std::_Select1st<std::pair<const_char_*const,_unsigned_short>_>,_StringLess,_std::allocator<std::pair<const_char_*const,_unsigned_short>_>_>
  ::clear(&(this->mStringToSID)._M_t);
  pCVar5 = (this->mGlobalSubrs).mCharStringsIndex;
  if (pCVar5 != (CharStringsIndex)0x0) {
    operator_delete__(pCVar5);
  }
  (this->mGlobalSubrs).mCharStringsIndex = (CharStringsIndex)0x0;
  if (this->mCharStrings != (CharStrings *)0x0) {
    lVar11 = 8;
    for (uVar17 = 0; uVar17 < this->mFontsCount; uVar17 = uVar17 + 1) {
      pvVar6 = *(void **)(&this->mCharStrings->mCharStringsType + lVar11);
      if (pvVar6 != (void *)0x0) {
        operator_delete__(pvVar6);
      }
      lVar11 = lVar11 + 0x10;
    }
    operator_delete(this->mCharStrings,0x10);
    this->mCharStrings = (CharStrings *)0x0;
  }
  pPVar7 = this->mPrivateDicts;
  if (pPVar7 != (PrivateDictInfo *)0x0) {
    pCVar2 = pPVar7[-1].mLocalSubrs;
    if (pCVar2 != (CharStrings *)0x0) {
      lVar11 = (long)pCVar2 * 0x48;
      do {
        std::
        _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>_>_>
                     *)((long)pPVar7 + lVar11 + -0x38));
        lVar11 = lVar11 + -0x48;
      } while (lVar11 != 0);
    }
    operator_delete__(&pPVar7[-1].mLocalSubrs,(long)pCVar2 * 0x48 + 8);
  }
  this->mPrivateDicts = (PrivateDictInfo *)0x0;
  for (p_Var10 = (this->mLocalSubrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &(this->mLocalSubrs)._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    p_Var12 = p_Var10[1]._M_parent;
    if (p_Var12->_M_parent != (_Base_ptr)0x0) {
      operator_delete__(p_Var12->_M_parent);
      p_Var12 = p_Var10[1]._M_parent;
    }
    operator_delete(p_Var12,0x10);
  }
  for (ppCVar14 = (this->mCharSets).
                  super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppCVar14 !=
      (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar14 = ppCVar14 + 1) {
    pCVar13 = *ppCVar14;
    if (pCVar13->mSIDs != (unsigned_short *)0x0) {
      operator_delete__(pCVar13->mSIDs);
      pCVar13 = *ppCVar14;
    }
    std::
    _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_IndexElement_*>,_std::_Select1st<std::pair<const_unsigned_short,_IndexElement_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_IndexElement_*>_>_>
    ::clear(&(pCVar13->mSIDToGlyphMap)._M_t);
    pCVar13 = *ppCVar14;
    if (pCVar13 != (CharSetInfo *)0x0) {
      std::
      _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_IndexElement_*>,_std::_Select1st<std::pair<const_unsigned_short,_IndexElement_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_IndexElement_*>_>_>
      ::~_Rb_tree(&(pCVar13->mSIDToGlyphMap)._M_t);
    }
    operator_delete(pCVar13,0x40);
  }
  ppCVar8 = (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar14 != ppCVar8) {
    (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar8;
  }
  ppEVar15 = (this->mEncodings).
             super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (ppEVar15 ==
        (this->mEncodings).super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppEVar9 = (this->mEncodings).
                super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppEVar15 != ppEVar9) {
        (this->mEncodings).super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppEVar9;
      }
      return;
    }
    pEVar18 = *ppEVar15;
    if (pEVar18->mEncoding == (Byte *)0x0) {
LAB_00171681:
      std::
      _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~_Rb_tree(&(pEVar18->mSupplements)._M_t);
    }
    else {
      operator_delete__(pEVar18->mEncoding);
      pEVar18 = *ppEVar15;
      if (pEVar18 != (EncodingsInfo *)0x0) goto LAB_00171681;
      pEVar18 = (EncodingsInfo *)0x0;
    }
    operator_delete(pEVar18,0x50);
    ppEVar15 = ppEVar15 + 1;
  } while( true );
}

Assistant:

void CFFFileInput::FreeData()
{
	mName.clear();
	mNameToIndex.clear();
	if(mTopDictIndex != NULL)
	{
		for(unsigned long i=0; i < mFontsCount;++i)
		{
			delete[] mTopDictIndex[i].mFDArray;
			delete[] mTopDictIndex[i].mFDSelect;
		}
		delete[] mTopDictIndex;
		mTopDictIndex = NULL;
	}
	if(mStrings != NULL)
	{
		for(unsigned long i =0 ; i <mStringsCount; ++ i)
			delete[] mStrings[i];
		delete[] mStrings;
		mStrings = NULL;
	}
	mStringToSID.clear();
	delete[] mGlobalSubrs.mCharStringsIndex;
	mGlobalSubrs.mCharStringsIndex = NULL;
	if(mCharStrings != NULL)
	{
		for(unsigned long i=0; i < mFontsCount; ++i)
			delete[] mCharStrings[i].mCharStringsIndex;
		delete mCharStrings;
		mCharStrings = NULL;
	}
	delete[] mPrivateDicts;
	mPrivateDicts = NULL;

	LongFilePositionTypeToCharStringsMap::iterator itLocalSubrs = mLocalSubrs.begin();
	for(; itLocalSubrs != mLocalSubrs.end(); ++itLocalSubrs)
	{
		delete[] itLocalSubrs->second->mCharStringsIndex;
		delete itLocalSubrs->second;
	}

	CharSetInfoVector::iterator itCharSets = mCharSets.begin();
	for(; itCharSets != mCharSets.end(); ++itCharSets)
	{
		delete[] (*itCharSets)->mSIDs;
		(*itCharSets)->mSIDToGlyphMap.clear();
		delete (*itCharSets);
	}
	mCharSets.clear();

	EncodingsInfoVector::iterator itEncodings = mEncodings.begin();
	for(; itEncodings != mEncodings.end(); ++itEncodings)
	{
		delete[] (*itEncodings)->mEncoding;
		delete (*itEncodings);
	}
	mEncodings.clear();
}